

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O3

double __thiscall Bob::ObliviousMultiplication(Bob *this,long arg1,long arg2)

{
  pointer plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  Message MVar8;
  Message local_50;
  double local_40;
  long local_38;
  
  iVar6 = (this->super_Party).rc;
  plVar1 = (this->super_Party).Randoms.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->super_Party).Randoms.super__Vector_base<long,_std::allocator<long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar1 >> 3) <
      (long)iVar6 + 3U) {
    iVar6 = 0;
  }
  local_40 = (double)(arg2 * arg1);
  (this->super_Party).rc = iVar6;
  local_50.scalar1 = arg2 - plVar1[iVar6];
  local_50.scalar2 = arg1 - plVar1[(long)iVar6 + 2];
  MVar8 = Client::Receive(this->cli);
  local_38 = MVar8.scalar2;
  Client::Send(this->cli,&local_50);
  lVar7 = (long)(this->super_Party).rc;
  plVar1 = (this->super_Party).Randoms.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = plVar1[lVar7];
  lVar3 = plVar1[lVar7 + 1];
  lVar4 = plVar1[lVar7 + 2];
  lVar5 = plVar1[lVar7 + 3];
  (this->super_Party).rc =
       (int)((lVar7 + 4U) %
            (ulong)((long)(this->super_Party).Randoms.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)plVar1 >> 3));
  return (double)((arg1 + lVar4) * local_38 + lVar5) * 0.5 +
         (double)((arg2 + lVar2) * MVar8.scalar1 + lVar3) * 0.5 + local_40;
}

Assistant:

double Bob::ObliviousMultiplication(long arg1, long arg2)
{
    double result = arg1 * arg2; //Bob locally computes x"y"
    Message msg_for_Alice,  msg_from_Alice;
    rc = ((rc + 3) <= Randoms.size() ? rc : 0);
    msg_for_Alice.scalar1 = arg2 - Randoms[rc];   //for computing x'y"
    msg_for_Alice.scalar2 = arg1 - Randoms[rc + 2]; //for computing x"y'
    msg_from_Alice = cli->Receive();
    cli->Send(msg_for_Alice);
    result += ((arg2 + Randoms[rc])*(msg_from_Alice.scalar1)+ Randoms[rc+1])/(double)2;
    result += ((arg1 + Randoms[rc+2])*(msg_from_Alice.scalar2) + Randoms[rc+3])/(double)2;
    rc = (rc+4) % Randoms.size();
    // printf("Bob's Share: %f\n", result);
    return result;
}